

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_secure_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::coap::CoapsTest_CoapsClientServerHello_Test::CoapsTest_CoapsClientServerHello_Test
          (CoapsTest_CoapsClientServerHello_Test *this)

{
  CoapsTest_CoapsClientServerHello_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__CoapsTest_CoapsClientServerHello_Test_003ebca0
  ;
  return;
}

Assistant:

TEST(CoapsTest, CoapsClientServerHello)
{
    DtlsConfig config;

    // Setup coap secure server
    config.mCaChain = ByteArray{kServerTrustAnchor.begin(), kServerTrustAnchor.end()};
    config.mOwnCert = ByteArray{kServerCert.begin(), kServerCert.end()};
    config.mOwnKey  = ByteArray{kServerKey.begin(), kServerKey.end()};

    config.mCaChain.push_back(0);
    config.mOwnCert.push_back(0);
    config.mOwnKey.push_back(0);

    auto eventBase = event_base_new();
    ASSERT_NE(eventBase, nullptr);

    CoapSecure coapsServer{eventBase, true};
    Resource   resHello{"/hello", [&coapsServer](const Request &aRequest) {
                          EXPECT_EQ(aRequest.GetType(), Type::kConfirmable);
                          EXPECT_EQ(aRequest.GetCode(), Code::kPost);

                          Response response{Type::kAcknowledgment, Code::kChanged};
                          response.Append("world");
                          EXPECT_EQ(coapsServer.SendResponse(aRequest, response), ErrorCode::kNone);
                      }};
    EXPECT_EQ(coapsServer.AddResource(resHello), ErrorCode::kNone);

    auto onServerConnected = [&coapsServer](const DtlsSession &aSession, Error aError) {
        EXPECT_EQ(aError, ErrorCode::kNone);
        EXPECT_EQ(&aSession, &coapsServer.GetDtlsSession());
        EXPECT_EQ(aSession.GetLocalPort(), kServerPort);
    };

    EXPECT_EQ(coapsServer.Init(config), ErrorCode::kNone);
    EXPECT_EQ(coapsServer.Start(onServerConnected, kServerAddr, kServerPort), ErrorCode::kNone);

    // Setup coap secure client
    config.mCaChain = ByteArray{kClientTrustAnchor.begin(), kClientTrustAnchor.end()};
    config.mOwnCert = ByteArray{kClientCert.begin(), kClientCert.end()};
    config.mOwnKey  = ByteArray{kClientKey.begin(), kClientKey.end()};

    config.mCaChain.push_back(0);
    config.mOwnCert.push_back(0);
    config.mOwnKey.push_back(0);

    CoapSecure coapsClient{eventBase, false};
    EXPECT_EQ(coapsClient.Init(config), ErrorCode::kNone);
    auto onClientConnected = [&coapsClient, eventBase](const DtlsSession &aSession, Error aError) {
        EXPECT_EQ(aError, ErrorCode::kNone);
        EXPECT_EQ(aSession.GetPeerPort(), kServerPort);

        Request request{Type::kConfirmable, Code::kPost};
        EXPECT_EQ(request.SetUriPath("/hello"), ErrorCode::kNone);
        auto onResponse = [eventBase](const Response *aResponse, Error aError) {
            EXPECT_EQ(aError, ErrorCode::kNone);
            EXPECT_NE(aResponse, nullptr);
            EXPECT_EQ(aResponse->GetType(), Type::kAcknowledgment);
            EXPECT_EQ(aResponse->GetCode(), Code::kChanged);
            EXPECT_EQ(aResponse->GetPayloadAsString(), "world");

            event_base_loopbreak(eventBase);
        };
        coapsClient.SendRequest(request, onResponse);
    };
    coapsClient.Connect(onClientConnected, kServerAddr, kServerPort);

    EXPECT_EQ(event_base_loop(eventBase, EVLOOP_NO_EXIT_ON_EMPTY), 0);
    event_base_free(eventBase);
}